

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Serializer::ValidateWriterRec
          (BP5Serializer *this,BP5WriterRec Rec,void *Variable)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  size_type sVar4;
  long in_RDX;
  long *in_RSI;
  VariableBase *VB;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  allocator *paVar5;
  uint in_stack_fffffffffffffcc4;
  string *in_stack_fffffffffffffcc8;
  string *message;
  string *in_stack_fffffffffffffcd0;
  string *activity;
  string *in_stack_fffffffffffffcd8;
  string *source;
  string *in_stack_fffffffffffffce0;
  string *component;
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [37];
  byte local_233;
  byte local_232;
  allocator local_231;
  string local_230 [39];
  undefined1 local_209 [40];
  undefined1 local_1e1 [40];
  undefined1 local_1b9 [40];
  undefined1 local_191 [40];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  long local_20;
  long *local_10;
  
  *in_RSI = in_RDX;
  local_20 = in_RDX;
  local_10 = in_RSI;
  sVar4 = std::
          vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
          ::size((vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
                  *)(in_RDX + 0xd8));
  if ((sVar4 == 0) && (local_10[4] != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Toolkit",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"format::BP5Serializer",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Marshal",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c8,"BP5 does not support removing operators after the first Put()",&local_c9);
    helper::Throw<std::logic_error>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
               in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    sVar4 = std::
            vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
            ::size((vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
                    *)(local_20 + 0xd8));
    if ((sVar4 == 0) || (local_10[4] != 0)) {
      sVar4 = std::
              vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
              ::size((vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
                      *)(local_20 + 0xd8));
      if (sVar4 < 2) {
        local_232 = 0;
        local_233 = 0;
        in_stack_fffffffffffffcc4 = in_stack_fffffffffffffcc4 & 0xffffff;
        if (local_10[4] != 0) {
          sVar4 = std::
                  vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
                  ::size((vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
                          *)(local_20 + 0xd8));
          in_stack_fffffffffffffcc4 = in_stack_fffffffffffffcc4 & 0xffffff;
          if (sVar4 != 0) {
            std::
            vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
            ::operator[]((vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
                          *)(local_20 + 0xd8),0);
            std::
            __shared_ptr_access<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0xd0fcb0);
            pcVar1 = (char *)local_10[4];
            std::allocator<char>::allocator();
            local_232 = 1;
            std::__cxx11::string::string(local_230,pcVar1,&local_231);
            local_233 = 1;
            bVar3 = std::operator!=(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
            in_stack_fffffffffffffcc4 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffcc4);
          }
        }
        uVar2 = in_stack_fffffffffffffcc4 >> 0x18;
        if ((local_233 & 1) != 0) {
          std::__cxx11::string::~string(local_230);
        }
        if ((local_232 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_231);
        }
        if ((char)uVar2 != '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_258,"Toolkit",&local_259);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_280,"format::BP5Serializer",&local_281);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2a8,"Marshal",&local_2a9);
          paVar5 = &local_2d1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_2d0,"BP5 does not support changing operators after the first Put()",
                     paVar5);
          helper::Throw<std::logic_error>
                    (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                     in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
          std::__cxx11::string::~string(local_2d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
          std::__cxx11::string::~string(local_2a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
          std::__cxx11::string::~string(local_280);
          std::allocator<char>::~allocator((allocator<char> *)&local_281);
          std::__cxx11::string::~string(local_258);
          std::allocator<char>::~allocator((allocator<char> *)&local_259);
        }
      }
      else {
        component = (string *)local_191;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(local_191 + 1),"Toolkit",(allocator *)component);
        source = (string *)local_1b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_1b9 + 1),"format::BP5Serializer",(allocator *)source);
        activity = (string *)local_1e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(local_1e1 + 1),"Marshal",(allocator *)activity);
        message = (string *)local_209;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_209 + 1),"BP5 does not support multiple operators",
                   (allocator *)message);
        helper::Throw<std::logic_error>(component,source,activity,message,in_stack_fffffffffffffcc4)
        ;
        std::__cxx11::string::~string((string *)(local_209 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_209);
        std::__cxx11::string::~string((string *)(local_1e1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_1e1);
        std::__cxx11::string::~string((string *)(local_1b9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_1b9);
        std::__cxx11::string::~string((string *)(local_191 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_191);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"Toolkit",&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"format::BP5Serializer",&local_119);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"Marshal",&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_168,"BP5 does not support adding operators after the first Put()",&local_169)
      ;
      helper::Throw<std::logic_error>
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                 in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
  }
  return;
}

Assistant:

void BP5Serializer::ValidateWriterRec(BP5Serializer::BP5WriterRec Rec, void *Variable)
{
    core::VariableBase *VB = static_cast<core::VariableBase *>(Variable);

    Rec->Key = Variable; // reset this, because Variable might have been destroyed and recreated
    if ((VB->m_Operations.size() == 0) && Rec->OperatorType)
    {
        // removed operator case
        helper::Throw<std::logic_error>(
            "Toolkit", "format::BP5Serializer", "Marshal",
            "BP5 does not support removing operators after the first Put()");
    }
    else if ((VB->m_Operations.size() > 0) && !Rec->OperatorType)
    {
        // removed operator case
        helper::Throw<std::logic_error>(
            "Toolkit", "format::BP5Serializer", "Marshal",
            "BP5 does not support adding operators after the first Put()");
    }
    else if (VB->m_Operations.size() > 1)
    {
        // removed operator case
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer", "Marshal",
                                        "BP5 does not support multiple operators");
    }
    else if (Rec->OperatorType && VB->m_Operations.size() &&
             (VB->m_Operations[0]->m_TypeString != std::string(Rec->OperatorType)))
    {
        // removed operator case
        helper::Throw<std::logic_error>(
            "Toolkit", "format::BP5Serializer", "Marshal",
            "BP5 does not support changing operators after the first Put()");
    }
}